

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::FillColumnSubClampPalCommand::Execute
          (FillColumnSubClampPalCommand *this,DrawerThread *thread)

{
  uint uVar1;
  int pitch_00;
  int iVar2;
  uchar *dest_00;
  uint32_t *puVar3;
  uint uVar4;
  uint uVar5;
  uint32_t b;
  uint32_t a;
  int pitch;
  uint32_t fg;
  uint32_t *bg2rgb;
  uint8_t *dest;
  int count;
  DrawerThread *thread_local;
  FillColumnSubClampPalCommand *this_local;
  
  dest_00 = (this->super_PalColumnCommand)._dest;
  puVar3 = (this->super_PalColumnCommand)._destblend;
  uVar1 = (this->super_PalColumnCommand)._srccolor;
  pitch_00 = (this->super_PalColumnCommand)._pitch;
  dest._4_4_ = DrawerThread::count_for_thread
                         (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y,
                          *(int *)&(this->super_PalColumnCommand).super_DrawerCommand.field_0xc);
  if (0 < dest._4_4_) {
    bg2rgb = (uint32_t *)
             DrawerThread::dest_for_thread<unsigned_char>
                       (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y,pitch_00,
                        dest_00);
    iVar2 = thread->num_cores;
    do {
      uVar4 = (uVar1 | 0x40100400) - puVar3[(byte)*bg2rgb];
      uVar5 = uVar4 & 0x40100400;
      uVar4 = uVar5 - (uVar5 >> 5) & uVar4 | 0x1f07c1f;
      *(BYTE *)bg2rgb = RGB32k.All[uVar4 & uVar4 >> 0xf];
      bg2rgb = (uint32_t *)((long)bg2rgb + (long)(iVar2 * pitch_00));
      dest._4_4_ = dest._4_4_ + -1;
    } while (dest._4_4_ != 0);
  }
  return;
}

Assistant:

void FillColumnSubClampPalCommand::Execute(DrawerThread *thread)
	{
		int count;
		uint8_t *dest;

		count = _count;

		dest = _dest;
		uint32_t *bg2rgb;
		uint32_t fg;

		bg2rgb = _destblend;
		fg = _srccolor | 0x40100400;
		int pitch = _pitch;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		pitch *= thread->num_cores;

		do
		{
			uint32_t a = fg - bg2rgb[*dest];
			uint32_t b = a;

			b &= 0x40100400;
			b = b - (b >> 5);
			a &= b;
			a |= 0x01f07c1f;
			*dest = RGB32k.All[a & (a >> 15)];
			dest += pitch;
		} while (--count);
	}